

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::userInvertReport(HighsSimplexAnalysis *this,bool header,bool force)

{
  stringstream *this_00;
  undefined8 uVar1;
  undefined8 in_RCX;
  void *in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  double extraout_XMM0_Qa;
  bool in_stack_0000002f;
  HighsSimplexAnalysis *in_stack_00000030;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  double local_58;
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  HighsSimplexAnalysis *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  HighsSimplexAnalysis *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 0x139) & 1) == 0) {
    HighsTimer::read((HighsTimer *)*in_RDI,0,in_RDX,
                     CONCAT71((int7)((ulong)in_RCX >> 8),in_SIL) & 0xffffffffffffff01);
    local_58 = extraout_XMM0_Qa;
  }
  else {
    local_58 = (double)in_RDI[0x136] + 1.0;
  }
  in_RDI[0x136] = local_58;
  if ((((ulong)in_RDX & 1) != 0) ||
     ((double)in_RDI[0x137] + (double)in_RDI[0x138] <= (double)in_RDI[0x136])) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    std::unique_ptr<std::__cxx11::stringstream,std::default_delete<std::__cxx11::stringstream>>::
    unique_ptr<std::default_delete<std::__cxx11::stringstream>,void>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(in_stack_ffffffffffffff90,
                (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffff88);
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    reportIterationObjective(in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
    reportInfeasibility(in_stack_00000030,in_stack_0000002f);
    if ((*(byte *)(in_RDI + 0x139) & 1) == 0) {
      reportRunTime(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                    (double)in_stack_ffffffffffffffd0);
    }
    std::
    unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x7b41ea);
    std::__cxx11::stringstream::str();
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0x12),kInfo,"%s\n",uVar1);
    std::__cxx11::string::~string(local_48);
    if ((in_SIL & 1) == 0) {
      in_RDI[0x137] = in_RDI[0x136];
    }
    if ((double)in_RDI[0x138] * 200.0 < (double)in_RDI[0x136]) {
      in_RDI[0x138] = (double)in_RDI[0x138] * 10.0;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::userInvertReport(const bool header,
                                            const bool force) {
  highs_run_time = timeless_log ? highs_run_time + 1 : timer_->read();
  if (!force && highs_run_time < last_user_log_time + delta_user_log_time)
    return;
  analysis_log = std::unique_ptr<std::stringstream>(new std::stringstream());
  reportIterationObjective(header);
  reportInfeasibility(header);
  if (!timeless_log) reportRunTime(header, highs_run_time);
  highsLogUser(log_options, HighsLogType::kInfo, "%s\n",
               analysis_log->str().c_str());
  if (!header) last_user_log_time = highs_run_time;
  if (highs_run_time > 200 * delta_user_log_time) delta_user_log_time *= 10;
}